

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imglsadf.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_308a::InputSourcePreprocessingForMelCepstrum::Get
          (InputSourcePreprocessingForMelCepstrum *this,
          vector<double,_std::allocator<double>_> *mlsa_digital_filter_coefficients)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  double dVar5;
  
  if (this->is_valid_ != true) {
    return false;
  }
  iVar3 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&this->mel_cepstrum_);
  if (((char)iVar3 == '\0') ||
     (bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
                        (&this->mel_cepstrum_to_mlsa_digital_filter_coefficients_,
                         (vector<double,_std::allocator<double>_> *)&this->mel_cepstrum_,
                         (vector<double,_std::allocator<double>_> *)mlsa_digital_filter_coefficients
                        ), !bVar2)) {
    return false;
  }
  if ((this->gamma_ != 0.0) || (NAN(this->gamma_))) {
    bVar2 = sptk::GeneralizedCepstrumGainNormalization::Run
                      (&this->generalized_cepstrum_gain_normalization_,
                       (vector<double,_std::allocator<double>_> *)mlsa_digital_filter_coefficients);
    if (!bVar2) {
      return false;
    }
    if (this->gain_flag_ == true) {
      dVar5 = log(*(mlsa_digital_filter_coefficients->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start);
      *(mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
       _M_impl.super__Vector_impl_data._M_start = dVar5;
    }
    pdVar4 = (mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    while (pdVar4 = pdVar4 + 1, pdVar4 != pdVar1) {
      *pdVar4 = *pdVar4 * this->gamma_;
    }
  }
  if (this->gain_flag_ == false) {
    *(mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
     .super__Vector_impl_data._M_start = 0.0;
    return true;
  }
  return true;
}

Assistant:

bool Get(std::vector<double>* mlsa_digital_filter_coefficients) override {
    if (!is_valid_) {
      return false;
    }

    if (!source_->Get(&mel_cepstrum_)) {
      return false;
    }

    if (!mel_cepstrum_to_mlsa_digital_filter_coefficients_.Run(
            mel_cepstrum_, mlsa_digital_filter_coefficients)) {
      return false;
    }

    if (0.0 != gamma_) {
      if (!generalized_cepstrum_gain_normalization_.Run(
              mlsa_digital_filter_coefficients)) {
        return false;
      }
      if (gain_flag_) {
        (*mlsa_digital_filter_coefficients)[0] =
            std::log((*mlsa_digital_filter_coefficients)[0]);
      }
      std::transform(mlsa_digital_filter_coefficients->begin() + 1,
                     mlsa_digital_filter_coefficients->end(),
                     mlsa_digital_filter_coefficients->begin() + 1,
                     [this](double b) { return b * gamma_; });
    }

    if (!gain_flag_) {
      (*mlsa_digital_filter_coefficients)[0] = 0.0;  // exp(0) = 1
    }

    return true;
  }